

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * IR::Instr::FindSingleDefInstr(OpCode opCode,Opnd *src)

{
  bool bVar1;
  Instr *pIVar2;
  Instr *local_30;
  RegOpnd *local_28;
  RegOpnd *src1;
  Opnd *src_local;
  OpCode opCode_local;
  
  bVar1 = Opnd::IsRegOpnd(src);
  if (bVar1) {
    local_28 = Opnd::AsRegOpnd(src);
  }
  else {
    local_28 = (RegOpnd *)0x0;
  }
  if (((local_28 == (RegOpnd *)0x0) || (bVar1 = StackSym::IsSingleDef(local_28->m_sym), !bVar1)) ||
     (pIVar2 = StackSym::GetInstrDef(local_28->m_sym), pIVar2->m_opcode != opCode)) {
    local_30 = (Instr *)0x0;
  }
  else {
    local_30 = StackSym::GetInstrDef(local_28->m_sym);
  }
  return local_30;
}

Assistant:

Instr*
Instr::FindSingleDefInstr(Js::OpCode opCode, Opnd* src)
{
    RegOpnd* src1 = src->IsRegOpnd() ? src->AsRegOpnd() : nullptr;

    return  src1 &&
        src1->m_sym->IsSingleDef() &&
        src1->m_sym->GetInstrDef()->m_opcode == opCode ?
        src1->m_sym->GetInstrDef() :
        nullptr;
}